

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

int __thiscall
CVmObjLookupTable::getp_remove_entry
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  char *pcVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  int iVar4;
  vm_lookup_val *pvVar5;
  vm_lookup_val *pvVar6;
  CVmObjLookupTable *this_00;
  uint hashval;
  vm_lookup_val *prv_entry;
  vm_val_t key;
  
  if (getp_remove_entry(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar4 = __cxa_guard_acquire(&getp_remove_entry(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar4 != 0) {
      getp_remove_entry::desc.min_argc_ = 1;
      getp_remove_entry::desc.opt_argc_ = 0;
      getp_remove_entry::desc.varargs_ = 0;
      __cxa_guard_release(&getp_remove_entry(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&getp_remove_entry::desc);
  if (iVar4 == 0) {
    key.typ = sp_[-1].typ;
    key._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
    key.val = sp_[-1].val;
    this_00 = this;
    sp_ = sp_ + -1;
    pvVar5 = find_entry(this,&key,&hashval,&prv_entry);
    if (pvVar5 == (vm_lookup_val *)0x0) {
      retval->typ = VM_NIL;
    }
    else {
      uVar3 = *(undefined4 *)&(pvVar5->val).field_0x4;
      aVar2 = (pvVar5->val).val;
      retval->typ = (pvVar5->val).typ;
      *(undefined4 *)&retval->field_0x4 = uVar3;
      retval->val = aVar2;
      add_undo_rec(this_00,self,LOOKUPTAB_UNDO_DEL,&key,retval);
      pcVar1 = (this->super_CVmObjCollection).super_CVmObject.ext_;
      pvVar6 = (vm_lookup_val *)(pcVar1 + (ulong)hashval * 8);
      if (prv_entry != (vm_lookup_val *)0x0) {
        pvVar6 = prv_entry;
      }
      pvVar6->nxt = pvVar5->nxt;
      pvVar5->nxt = *(vm_lookup_val **)(pcVar1 + 8);
      *(vm_lookup_val **)(pcVar1 + 8) = pvVar5;
      (pvVar5->key).typ = VM_EMPTY;
      (pvVar5->val).typ = VM_EMPTY;
    }
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_remove_entry(VMG_ vm_obj_id_t self,
                                         vm_val_t *retval, uint *argc)
{
    vm_lookup_val *entry;
    vm_val_t key;
    uint hashval;
    vm_lookup_val *prv_entry;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the key */
    G_stk->pop(&key);

    /* find the entry for this key */
    entry = find_entry(vmg_ &key, &hashval, &prv_entry);

    /* if we found the entry, delete it */
    if (entry != 0)
    {
        /* the return value is the value stored at this key */
        *retval = entry->val;

        /* generate undo for the change */
        add_undo_rec(vmg_ self, LOOKUPTAB_UNDO_DEL, &key, retval);

        /* unlink the entry */
        unlink_entry(vmg_ entry, hashval, prv_entry);
    }
    else
    {
        /* not found - the return value is nil */
        retval->set_nil();
    }

    /* handled */
    return TRUE;
}